

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void processCompileOptionsInternal
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *options,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueOptions,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugOptions,char *logName,string *language)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCompiledGeneratorExpression *pcVar2;
  pointer pcVar3;
  char *pcVar4;
  long *plVar5;
  cmake *this;
  undefined8 *puVar6;
  size_type *psVar7;
  ulong *puVar8;
  long *plVar9;
  pointer __obj;
  ulong uVar10;
  string usedOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryOptions;
  pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  __p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  long *local_198;
  undefined8 local_190;
  long local_188;
  undefined8 uStack_180;
  cmGeneratorTarget *local_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  undefined4 uStack_158;
  undefined4 uStack_154;
  ulong *local_150;
  long local_148;
  ulong local_140 [2];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  pointer local_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  cmListFileBacktrace local_b0;
  long *local_70 [2];
  long local_60 [2];
  pointer local_50;
  cmGeneratorExpressionDAGChecker *local_48;
  string *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_110 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (entries->
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (local_110 != local_50) {
    paVar1 = &local_b0.Context.Name.field_2;
    local_178 = tgt;
    local_48 = dagChecker;
    local_40 = config;
    local_38 = options;
    do {
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar4 = cmCompiledGeneratorExpression::Evaluate
                         (((*local_110)->ge).x_,local_178->LocalGenerator,local_40,false,local_178,
                          local_48,language);
      std::__cxx11::string::string((string *)&local_b0,pcVar4,(allocator *)&local_130);
      cmSystemTools::ExpandListArgument((string *)&local_b0,&local_c8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.Context.Name._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0.Context.Name._M_dataplus._M_p,
                        local_b0.Context.Name.field_2._M_allocated_capacity + 1);
      }
      local_130 = &local_120;
      local_128 = 0;
      local_120 = 0;
      for (__obj = local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __obj != local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; __obj = __obj + 1) {
        cmsys::
        hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::resize(&uniqueOptions->_M_ht,(uniqueOptions->_M_ht)._M_num_elements + 1);
        cmsys::
        hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::insert_unique_noresize
                  ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                    *)&local_b0,&uniqueOptions->_M_ht,__obj);
        if (local_b0.Context.Name.field_2._M_local_buf[0] == '\x01') {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_38,__obj);
          if (debugOptions) {
            std::operator+(&local_1b8," * ",__obj);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
            psVar7 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_b0.Context.Name.field_2._M_allocated_capacity = *psVar7;
              local_b0.Context.Name.field_2._8_8_ = plVar5[3];
              local_b0.Context.Name._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_b0.Context.Name.field_2._M_allocated_capacity = *psVar7;
              local_b0.Context.Name._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_b0.Context.Name._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&local_130,(ulong)local_b0.Context.Name._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.Context.Name._M_dataplus._M_p != paVar1) {
              operator_delete(local_b0.Context.Name._M_dataplus._M_p,
                              local_b0.Context.Name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      if (local_128 != 0) {
        this = cmLocalGenerator::GetCMakeInstance(local_178->LocalGenerator);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Used compile ","");
        plVar5 = (long *)std::__cxx11::string::append((char *)local_70);
        local_170 = &local_160;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_160 = *puVar8;
          uStack_158 = (undefined4)plVar5[3];
          uStack_154 = *(undefined4 *)((long)plVar5 + 0x1c);
        }
        else {
          local_160 = *puVar8;
          local_170 = (ulong *)*plVar5;
        }
        local_168 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_150 = local_140;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150," for target ","");
        uVar10 = 0xf;
        if (local_170 != &local_160) {
          uVar10 = local_160;
        }
        if (uVar10 < (ulong)(local_148 + local_168)) {
          uVar10 = 0xf;
          if (local_150 != local_140) {
            uVar10 = local_140[0];
          }
          if (uVar10 < (ulong)(local_148 + local_168)) goto LAB_0038afca;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_170);
        }
        else {
LAB_0038afca:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_150);
        }
        local_198 = &local_188;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_188 = *plVar5;
          uStack_180 = puVar6[3];
        }
        else {
          local_188 = *plVar5;
          local_198 = (long *)*puVar6;
        }
        local_190 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_198,
                                    (ulong)(local_178->Target->Name)._M_dataplus._M_p);
        local_108 = &local_f8;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_f8 = *plVar9;
          lStack_f0 = plVar5[3];
        }
        else {
          local_f8 = *plVar9;
          local_108 = (long *)*plVar5;
        }
        local_100 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_e8 = &local_d8;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_d8 = *plVar9;
          lStack_d0 = plVar5[3];
        }
        else {
          local_d8 = *plVar9;
          local_e8 = (long *)*plVar5;
        }
        local_e0 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_130);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_1b8.field_2._M_allocated_capacity = *psVar7;
          local_1b8.field_2._8_4_ = (undefined4)plVar5[3];
          local_1b8.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
        }
        else {
          local_1b8.field_2._M_allocated_capacity = *psVar7;
          local_1b8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1b8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        pcVar2 = ((*local_110)->ge).x_;
        pcVar3 = (pcVar2->Backtrace).Context.Name._M_dataplus._M_p;
        local_b0.Context.Name._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar3,
                   pcVar3 + (pcVar2->Backtrace).Context.Name._M_string_length);
        local_b0.Context.Line = (pcVar2->Backtrace).Context.Line;
        local_b0.Snapshot.Position.Position = (pcVar2->Backtrace).Snapshot.Position.Position;
        local_b0.Snapshot.State = (pcVar2->Backtrace).Snapshot.State;
        local_b0.Snapshot.Position.Tree = (pcVar2->Backtrace).Snapshot.Position.Tree;
        cmake::IssueMessage(this,LOG,&local_1b8,&local_b0,false);
        cmListFileBacktrace::~cmListFileBacktrace(&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        if (local_150 != local_140) {
          operator_delete(local_150,local_140[0] + 1);
        }
        if (local_170 != &local_160) {
          operator_delete(local_170,local_160 + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      local_110 = local_110 + 1;
    } while (local_110 != local_50);
  }
  return;
}

Assistant:

static void processCompileOptionsInternal(cmGeneratorTarget const* tgt,
      const std::vector<cmGeneratorTarget::TargetPropertyEntry*> &entries,
      std::vector<std::string> &options,
      UNORDERED_SET<std::string> &uniqueOptions,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugOptions, const char *logName,
      std::string const& language)
{
  for (std::vector<cmGeneratorTarget::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    std::vector<std::string> entryOptions;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(
                                        tgt->GetLocalGenerator(),
                                              config,
                                              false,
                                              tgt,
                                              dagChecker,
                                              language),
                                    entryOptions);
    std::string usedOptions;
    for(std::vector<std::string>::iterator
          li = entryOptions.begin(); li != entryOptions.end(); ++li)
      {
      std::string const& opt = *li;

      if(uniqueOptions.insert(opt).second)
        {
        options.push_back(opt);
        if (debugOptions)
          {
          usedOptions += " * " + opt + "\n";
          }
        }
      }
    if (!usedOptions.empty())
      {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used compile ") + logName
                            + std::string(" for target ")
                            + tgt->GetName() + ":\n"
                            + usedOptions, (*it)->ge->GetBacktrace());
      }
    }
}